

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINGetWorkSpace(void *kinmem,long *lenrw,long *leniw)

{
  KINMem kin_mem;
  long *leniw_local;
  long *lenrw_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINGetWorkSpace","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else {
    *lenrw = *(long *)((long)kinmem + 0x1c0);
    *leniw = *(long *)((long)kinmem + 0x1c8);
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINGetWorkSpace(void *kinmem, long int *lenrw, long int *leniw)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINGetWorkSpace", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  *lenrw = lrw;
  *leniw = liw;

  return(KIN_SUCCESS);
}